

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateDistributionVector.h
# Opt level: O1

StateDistributionVector * __thiscall StateDistributionVector::Clone(StateDistributionVector *this)

{
  StateDistributionVector *pSVar1;
  
  pSVar1 = (StateDistributionVector *)operator_new(0x20);
  (pSVar1->super_StateDistribution)._vptr_StateDistribution =
       (_func_int **)&PTR__StateDistribution_0059cc60;
  std::vector<double,_std::allocator<double>_>::vector(&pSVar1->super_SDV,&this->super_SDV);
  (pSVar1->super_StateDistribution)._vptr_StateDistribution =
       (_func_int **)&PTR__StateDistributionVector_0059cb98;
  return pSVar1;
}

Assistant:

virtual StateDistributionVector* Clone() const
        { return new StateDistributionVector(*this); }